

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O3

CatalogException *
duckdb::Catalog::CreateMissingEntryException
          (CatalogException *__return_storage_ptr__,CatalogEntryRetriever *retriever,
          EntryLookupInfo *lookup_info,reference_set_t<SchemaCatalogEntry> *schemas)

{
  CatalogType CVar1;
  AttachedDatabase *pAVar2;
  pointer pcVar3;
  undefined1 auVar4 [8];
  size_type sVar5;
  DatabaseManager *this;
  DBConfig *this_00;
  RETURN_TYPE RVar6;
  long *plVar7;
  reference pvVar8;
  undefined8 *puVar9;
  reference pvVar10;
  long lVar11;
  pointer pbVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  ulong *puVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  CatalogType type;
  CatalogType extraout_DL;
  CatalogType extraout_DL_00;
  CatalogType extraout_DL_01;
  CatalogType CVar16;
  CatalogType type_00;
  CatalogType type_01;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar17;
  undefined8 extraout_RDX_01;
  SimilarCatalogEntry *entry;
  _Alloc_hider _Var18;
  pointer pSVar19;
  uint uVar20;
  duckdb *this_01;
  optional_ptr<duckdb::SchemaCatalogEntry,_true> *this_02;
  ClientContext *context;
  uint uVar22;
  string *psVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  double dVar25;
  pair<std::__detail::_Node_iterator<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true,_true>,_bool>
  pVar26;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar27;
  string did_you_mean;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  suggestions;
  string schema_name;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_true>
  lookup_result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  other_types;
  string extension_name;
  vector<duckdb::SimilarCatalogEntry,_true> unseen_entries;
  vector<duckdb::SimilarCatalogEntry,_true> entries;
  bool qualify_schema;
  vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true> databases;
  reference_set_t<SchemaCatalogEntry> unseen_schemas;
  string local_2f8;
  undefined1 local_2d8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  _Base_ptr local_2b8;
  ulong local_2b0;
  string local_2a8;
  string *local_288;
  string local_280;
  CatalogException *local_260;
  undefined1 local_258 [24];
  long lStack_240;
  EntryLookupInfo *local_230;
  string local_228;
  ClientContext *local_208;
  vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_> local_200;
  vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_> local_1e8;
  string local_1d0;
  CatalogEntryRetriever *local_1b0;
  string *local_1a8;
  vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true> local_1a0;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  _Hashtable<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_a8;
  string local_70;
  string local_50;
  uint uVar21;
  
  context = retriever->context;
  local_260 = __return_storage_ptr__;
  local_230 = lookup_info;
  local_1b0 = retriever;
  SimilarEntriesInSchemas
            ((vector<duckdb::SimilarCatalogEntry,_true> *)&local_1e8,context,lookup_info,schemas);
  local_a8._M_buckets = &local_a8._M_single_bucket;
  local_a8._M_bucket_count = 1;
  local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8._M_element_count = 0;
  local_a8._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8._M_rehash_policy._M_next_resize = 0;
  local_a8._M_single_bucket = (__node_base_ptr)0x0;
  this = DatabaseManager::Get(context);
  DatabaseManager::GetDatabases(&local_1a0,this,context);
  this_00 = DBConfig::GetConfig(context);
  RVar6 = DBConfig::GetSetting<duckdb::CatalogErrorMaxSchemasSetting>(this_00,context);
  CVar16 = (CatalogType)extraout_RDX;
  local_1a8 = (string *)
              local_1a0.
              super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_208 = context;
  if (local_1a0.
      super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1a0.
      super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar17 = extraout_RDX;
    psVar23 = (string *)
              local_1a0.
              super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      CVar16 = (CatalogType)uVar17;
      if (RVar6 <= local_a8._M_element_count) break;
      AttachedDatabase::GetCatalog((AttachedDatabase *)(psVar23->_M_dataplus)._M_p);
      local_288 = psVar23;
      GetAllSchemas((vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> *)local_2d8,
                    context);
      paVar13 = local_2d0;
      uVar17 = extraout_RDX_00;
      auVar4 = local_2d8;
      context = local_208;
      while ((local_208 = context, auVar4 != (undefined1  [8])paVar13 &&
             (local_a8._M_element_count < RVar6))) {
        local_2f8._M_dataplus._M_p = *(pointer *)auVar4;
        local_228._M_dataplus._M_p = (pointer)&local_a8;
        pVar26 = ::std::
                 _Hashtable<std::reference_wrapper<duckdb::SchemaCatalogEntry>,std::reference_wrapper<duckdb::SchemaCatalogEntry>,std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>>,std::__detail::_Identity,duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::
                 _M_insert<std::reference_wrapper<duckdb::SchemaCatalogEntry>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::reference_wrapper<duckdb::SchemaCatalogEntry>,true>>>>
                           ((_Hashtable<std::reference_wrapper<duckdb::SchemaCatalogEntry>,std::reference_wrapper<duckdb::SchemaCatalogEntry>,std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>>,std::__detail::_Identity,duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                             *)&local_a8,&local_2f8,&local_228);
        uVar17 = pVar26._8_8_;
        auVar4 = (undefined1  [8])((long)auVar4 + 8);
        context = local_208;
      }
      if (local_2d8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_2d8);
        uVar17 = extraout_RDX_01;
      }
      CVar16 = (CatalogType)uVar17;
      psVar23 = (string *)&local_288->_M_string_length;
    } while (psVar23 != local_1a8);
  }
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  local_228._M_string_length = 0;
  local_228.field_2._M_local_buf[0] = '\0';
  CVar1 = local_230->catalog_type;
  this_01 = (duckdb *)(ulong)CVar1;
  psVar23 = local_230->name;
  uVar20 = (uint)CVar1;
  uVar21 = (uint)CVar1;
  if ((byte)(CVar1 - TABLE_FUNCTION_ENTRY) < 4) {
    ExtensionHelper::FindExtensionInFunctionEntries<706ul>
              ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_true>
                *)&local_280,(ExtensionHelper *)psVar23,(string *)"!__postfix",
               (ExtensionFunctionEntry (*) [706])schemas);
    sVar5 = local_280._M_string_length;
    if (local_280._M_dataplus._M_p != (pointer)local_280._M_string_length) {
      local_258._0_8_ = (pointer)0x0;
      local_258._8_8_ = (pointer)0x0;
      local_258._16_8_ = (pointer)0x0;
      local_2d8 = (undefined1  [8])&local_2c8;
      local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      local_2c8._M_allocated_capacity = local_2c8._M_allocated_capacity & 0xffffffffffffff00;
      _Var18._M_p = local_280._M_dataplus._M_p;
      local_288 = psVar23;
      do {
        CVar16 = (CatalogType)*(long *)(_Var18._M_p + 0x20);
        if (CVar1 == CVar16) {
LAB_00d330f0:
          ::std::__cxx11::string::_M_assign((string *)&local_228);
          break;
        }
        uVar22 = (uint)CVar16;
        if (uVar20 < 0x20) {
          if ((0x4c000000U >> (uVar21 & 0x1f) & 1) == 0) {
            if ((0x92000000U >> (uVar20 & 0x1f) & 1) != 0) {
LAB_00d33065:
              if ((uVar22 < 0x20) && ((0x92000000U >> (uVar22 & 0x1f) & 1) != 0)) goto LAB_00d330f0;
            }
          }
          else {
            if ((uVar22 < 0x1f) && ((0x4c000000U >> (uVar22 & 0x1f) & 1) != 0)) goto LAB_00d330f0;
            if (uVar21 == 0x1c) goto LAB_00d33065;
          }
        }
        ::std::__cxx11::string::_M_assign((string *)local_2d8);
        CatalogTypeToString_abi_cxx11_(&local_2f8,(duckdb *)(ulong)CVar16,type);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258,
                   &local_2f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
          operator_delete(local_2f8._M_dataplus._M_p);
        }
        _Var18._M_p = _Var18._M_p + 0x28;
      } while (_Var18._M_p != (pointer)sVar5);
      psVar23 = local_288;
      if (local_228._M_string_length == 0) {
        if (local_258._8_8_ - local_258._0_8_ == 0x20) {
          pvVar10 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                  *)local_258,0);
          local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2f8,
                     "%s with name \"%s\" is not in the catalog, a function by this name exists in the %s extension, but it\'s of a different type, namely %s"
                     ,"");
          CatalogTypeToString_abi_cxx11_(&local_50,this_01,type_00);
          pcVar3 = (psVar23->_M_dataplus)._M_p;
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c8,pcVar3,pcVar3 + psVar23->_M_string_length);
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e8,local_2d8,(char *)((long)local_2d8 + (long)local_2d0));
          pcVar3 = (pvVar10->_M_dataplus)._M_p;
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_108,pcVar3,pcVar3 + pvVar10->_M_string_length);
          CatalogException::
          CatalogException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    (local_260,&local_2f8,&local_50,&local_c8,&local_e8,&local_108);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
LAB_00d33664:
            operator_delete(local_2f8._M_dataplus._M_p);
          }
        }
        else {
          paVar13 = &local_2a8.field_2;
          local_2a8._M_dataplus._M_p = (pointer)paVar13;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,", ","");
          StringUtil::Join(&local_2f8,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            *)local_258,&local_2a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != paVar13) {
            operator_delete(local_2a8._M_dataplus._M_p);
          }
          local_2a8._M_dataplus._M_p = (pointer)paVar13;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2a8,
                     "%s with name \"%s\" is not in the catalog, functions with this name exist in the %s extension, but they are of different types, namely %s"
                     ,"");
          CatalogTypeToString_abi_cxx11_(&local_70,this_01,type_01);
          pcVar3 = (psVar23->_M_dataplus)._M_p;
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_128,pcVar3,pcVar3 + psVar23->_M_string_length);
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,local_2d8,(char *)((long)local_2d8 + (long)local_2d0));
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_168,local_2f8._M_dataplus._M_p,
                     local_2f8._M_dataplus._M_p + local_2f8._M_string_length);
          CatalogException::
          CatalogException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    (local_260,&local_2a8,&local_70,&local_128,&local_148,&local_168);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != paVar13) {
            operator_delete(local_2a8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) goto LAB_00d33664;
        }
        if (local_2d8 != (undefined1  [8])&local_2c8) {
          operator_delete((void *)local_2d8);
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_258);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>_>_>
                   *)&local_280);
        goto LAB_00d33bff;
      }
      if (local_2d8 != (undefined1  [8])&local_2c8) {
        operator_delete((void *)local_2d8);
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_258);
      context = local_208;
    }
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>_>_>
               *)&local_280);
    CVar16 = extraout_DL;
  }
  else {
    if (uVar21 == 7) {
      ExtensionHelper::FindExtensionInEntries<130ul>
                ((string *)local_2d8,(ExtensionHelper *)psVar23,(string *)&EXTENSION_COLLATIONS,
                 (ExtensionEntry (*) [130])schemas);
    }
    else if (uVar21 == 0x1d) {
      ExtensionHelper::FindExtensionInEntries<2ul>
                ((string *)local_2d8,(ExtensionHelper *)psVar23,(string *)"parquet",
                 (ExtensionEntry (*) [2])schemas);
    }
    else {
      if (uVar20 != 8) goto LAB_00d3319a;
      ExtensionHelper::FindExtensionInEntries<3ul>
                ((string *)local_2d8,(ExtensionHelper *)psVar23,(string *)&EXTENSION_TYPES,
                 (ExtensionEntry (*) [3])schemas);
    }
    ::std::__cxx11::string::operator=((string *)&local_228,(string *)local_2d8);
    CVar16 = extraout_DL_00;
    if (local_2d8 != (undefined1  [8])&local_2c8) {
      operator_delete((void *)local_2d8);
      CVar16 = extraout_DL_01;
    }
  }
LAB_00d3319a:
  if (local_228._M_string_length != 0) {
    CatalogTypeToString_abi_cxx11_(&local_1d0,this_01,CVar16);
    plVar7 = (long *)::std::__cxx11::string::append((char *)&local_1d0);
    pbVar12 = (pointer)(plVar7 + 2);
    if ((pointer)*plVar7 == pbVar12) {
      local_258._16_8_ = (pbVar12->_M_dataplus)._M_p;
      lStack_240 = plVar7[3];
      local_258._0_8_ = (pointer)(local_258 + 0x10);
    }
    else {
      local_258._16_8_ = (pbVar12->_M_dataplus)._M_p;
      local_258._0_8_ = (pointer)*plVar7;
    }
    local_258._8_8_ = plVar7[1];
    *plVar7 = (long)pbVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)::std::__cxx11::string::_M_append(local_258,(ulong)(psVar23->_M_dataplus)._M_p)
    ;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar13) {
      local_280.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_280.field_2._8_8_ = plVar7[3];
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    }
    else {
      local_280.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_280._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_280._M_string_length = plVar7[1];
    *plVar7 = (long)paVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar9 = (undefined8 *)::std::__cxx11::string::append((char *)&local_280);
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 == paVar13) {
      local_2a8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2a8.field_2._8_8_ = puVar9[3];
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    }
    else {
      local_2a8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2a8._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_2a8._M_string_length = puVar9[1];
    *puVar9 = paVar13;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    plVar7 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_2a8,(ulong)local_228._M_dataplus._M_p);
    paVar13 = &local_2f8.field_2;
    puVar14 = (ulong *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar14) {
      local_2f8.field_2._M_allocated_capacity = *puVar14;
      local_2f8.field_2._8_8_ = plVar7[3];
      local_2f8._M_dataplus._M_p = (pointer)paVar13;
    }
    else {
      local_2f8.field_2._M_allocated_capacity = *puVar14;
      local_2f8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_2f8._M_string_length = plVar7[1];
    *plVar7 = (long)puVar14;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar9 = (undefined8 *)::std::__cxx11::string::append((char *)&local_2f8);
    paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 == paVar24) {
      local_2c8._M_allocated_capacity = paVar24->_M_allocated_capacity;
      local_2c8._8_8_ = puVar9[3];
      local_2d8 = (undefined1  [8])&local_2c8;
    }
    else {
      local_2c8._M_allocated_capacity = paVar24->_M_allocated_capacity;
      local_2d8 = (undefined1  [8])*puVar9;
    }
    local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar9[1];
    *puVar9 = paVar24;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar13) {
      operator_delete(local_2f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p);
    }
    if ((pointer)local_258._0_8_ != (pointer)(local_258 + 0x10)) {
      operator_delete((void *)local_258._0_8_);
    }
    if ((void *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,local_1d0._M_dataplus._M_p._0_1_) !=
        (void *)((long)&local_1d0 + 0x10U)) {
      operator_delete((void *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,
                                       local_1d0._M_dataplus._M_p._0_1_));
    }
    ExtensionHelper::AddExtensionInstallHintToErrorMsg
              (&local_2f8,context,(string *)local_2d8,&local_228);
    ::std::__cxx11::string::operator=((string *)local_2d8,(string *)&local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar13) {
      operator_delete(local_2f8._M_dataplus._M_p);
    }
    CatalogException::CatalogException(local_260,(string *)local_2d8);
    if (local_2d8 != (undefined1  [8])&local_2c8) {
      operator_delete((void *)local_2d8);
    }
    goto LAB_00d33bff;
  }
  SimilarEntriesInSchemas
            ((vector<duckdb::SimilarCatalogEntry,_true> *)&local_200,context,local_230,
             (reference_set_t<SchemaCatalogEntry> *)&local_a8);
  local_2c8._8_8_ = &local_2d0;
  local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((ulong)local_2d0 & 0xffffffff00000000);
  local_2c8._M_allocated_capacity = 0;
  local_2b0 = 0;
  local_2b8 = (_Base_ptr)local_2c8._8_8_;
  if (local_200.
      super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_200.
      super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
LAB_00d3395a:
    if (local_1e8.
        super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1e8.
        super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pSVar19 = local_1e8.
                super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_2d8,&pSVar19->name);
        pSVar19 = pSVar19 + 1;
      } while (pSVar19 !=
               local_1e8.
               super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  else {
    pvVar8 = vector<duckdb::SimilarCatalogEntry,_true>::operator[]
                       ((vector<duckdb::SimilarCatalogEntry,_true> *)&local_200,0);
    if ((pvVar8->score != 1.0) || (NAN(pvVar8->score))) {
      pvVar8 = vector<duckdb::SimilarCatalogEntry,_true>::operator[]
                         ((vector<duckdb::SimilarCatalogEntry,_true> *)&local_200,0);
      local_288 = (string *)pvVar8->score;
      if (local_1e8.
          super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_1e8.
          super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        dVar25 = 0.0;
      }
      else {
        pvVar8 = vector<duckdb::SimilarCatalogEntry,_true>::operator[]
                           ((vector<duckdb::SimilarCatalogEntry,_true> *)&local_1e8,0);
        dVar25 = pvVar8->score;
      }
      if ((double)local_288 + -0.2 <= dVar25) goto LAB_00d3395a;
    }
    if (local_200.
        super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_200.
        super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this_02 = &(local_200.
                  super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start)->schema;
      do {
        optional_ptr<duckdb::SchemaCatalogEntry,_true>::CheckValid(this_02);
        pAVar2 = ((this_02->ptr->super_InCatalogEntry).catalog)->db;
        local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
        pcVar3 = (pAVar2->super_CatalogEntry).name._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2f8,pcVar3,
                   pcVar3 + (pAVar2->super_CatalogEntry).name._M_string_length);
        optional_ptr<duckdb::SchemaCatalogEntry,_true>::CheckValid(this_02);
        pcVar3 = (this_02->ptr->super_InCatalogEntry).super_CatalogEntry.name._M_dataplus._M_p;
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2a8,pcVar3,
                   pcVar3 + (this_02->ptr->super_InCatalogEntry).super_CatalogEntry.name.
                            _M_string_length);
        FindMinimalQualification
                  (local_1b0,&local_2f8,&local_2a8,(bool *)local_258,(bool *)&local_1d0);
        SimilarCatalogEntry::GetQualifiedName_abi_cxx11_
                  (&local_280,(SimilarCatalogEntry *)(this_02 + -5),(bool)local_258[0],
                   (bool)local_1d0._M_dataplus._M_p._0_1_);
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_2d8,&local_280);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
          operator_delete(local_2f8._M_dataplus._M_p);
        }
        pSVar19 = (pointer)(this_02 + 1);
        this_02 = this_02 + 6;
      } while (pSVar19 !=
               local_200.
               super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  paVar13 = &local_2f8.field_2;
  local_2f8._M_string_length = 0;
  local_2f8.field_2._M_allocated_capacity =
       local_2f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_2f8._M_dataplus._M_p = (pointer)paVar13;
  if (local_2b0 < 3) {
    paVar24 = &local_280.field_2;
    local_280._M_dataplus._M_p = (pointer)paVar24;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_280," or ","");
    StringUtil::Join(&local_2a8,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2d8,&local_280);
    ::std::__cxx11::string::operator=((string *)&local_2f8,(string *)&local_2a8);
    _Var18._M_p = local_280._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p);
      _Var18._M_p = local_280._M_dataplus._M_p;
    }
  }
  else {
    lVar11 = ::std::_Rb_tree_decrement((_Rb_tree_node_base *)&local_2d0);
    paVar24 = &local_2a8.field_2;
    local_2a8._M_dataplus._M_p = (pointer)paVar24;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a8,*(long *)(lVar11 + 0x20),
               *(long *)(lVar11 + 0x28) + *(long *)(lVar11 + 0x20));
    pVar27 = ::std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2d8,&local_2a8);
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2d8,(_Base_ptr)pVar27.first._M_node,(_Base_ptr)pVar27.second._M_node);
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,", ","");
    StringUtil::Join(&local_1d0,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2d8,&local_188);
    plVar7 = (long *)::std::__cxx11::string::append((char *)&local_1d0);
    pbVar12 = (pointer)(plVar7 + 2);
    if ((pointer)*plVar7 == pbVar12) {
      local_258._16_8_ = (pbVar12->_M_dataplus)._M_p;
      lStack_240 = plVar7[3];
      local_258._0_8_ = (pointer)(local_258 + 0x10);
    }
    else {
      local_258._16_8_ = (pbVar12->_M_dataplus)._M_p;
      local_258._0_8_ = (pointer)*plVar7;
    }
    local_258._8_8_ = plVar7[1];
    *plVar7 = (long)pbVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar9 = (undefined8 *)
             ::std::__cxx11::string::_M_append(local_258,(ulong)local_2a8._M_dataplus._M_p);
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 == paVar15) {
      local_280.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_280.field_2._8_8_ = puVar9[3];
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    }
    else {
      local_280.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_280._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_280._M_string_length = puVar9[1];
    *puVar9 = paVar15;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)&local_2f8,(string *)&local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p);
    }
    if ((pointer)local_258._0_8_ != (pointer)(local_258 + 0x10)) {
      operator_delete((void *)local_258._0_8_);
    }
    if ((void *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,local_1d0._M_dataplus._M_p._0_1_) !=
        (void *)((long)&local_1d0 + 0x10U)) {
      operator_delete((void *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,
                                       local_1d0._M_dataplus._M_p._0_1_));
    }
    _Var18._M_p = local_2a8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p);
      _Var18._M_p = local_2a8._M_dataplus._M_p;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var18._M_p != paVar24) {
    operator_delete(_Var18._M_p);
  }
  CatalogException::MissingEntry(local_260,local_230,&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar13) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2d8);
  ::std::vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>::~vector
            (&local_200);
LAB_00d33bff:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  if ((string *)
      local_1a0.
      super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (string *)0x0) {
    operator_delete(local_1a0.
                    super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  ::std::
  _Hashtable<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_a8);
  ::std::vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>::~vector
            (&local_1e8);
  return local_260;
}

Assistant:

CatalogException Catalog::CreateMissingEntryException(CatalogEntryRetriever &retriever,
                                                      const EntryLookupInfo &lookup_info,
                                                      const reference_set_t<SchemaCatalogEntry> &schemas) {
	auto &context = retriever.GetContext();
	auto entries = SimilarEntriesInSchemas(context, lookup_info, schemas);

	reference_set_t<SchemaCatalogEntry> unseen_schemas;
	auto &db_manager = DatabaseManager::Get(context);
	auto databases = db_manager.GetDatabases(context);
	auto &config = DBConfig::GetConfig(context);

	auto max_schema_count = config.GetSetting<CatalogErrorMaxSchemasSetting>(context);
	for (auto database : databases) {
		if (unseen_schemas.size() >= max_schema_count) {
			break;
		}
		auto &catalog = database.get().GetCatalog();
		auto current_schemas = catalog.GetAllSchemas(context);
		for (auto &current_schema : current_schemas) {
			if (unseen_schemas.size() >= max_schema_count) {
				break;
			}
			unseen_schemas.insert(current_schema.get());
		}
	}
	// check if the entry exists in any extension
	string extension_name;
	auto type = lookup_info.GetCatalogType();
	auto &entry_name = lookup_info.GetEntryName();
	if (type == CatalogType::TABLE_FUNCTION_ENTRY || type == CatalogType::SCALAR_FUNCTION_ENTRY ||
	    type == CatalogType::AGGREGATE_FUNCTION_ENTRY || type == CatalogType::PRAGMA_FUNCTION_ENTRY) {
		auto lookup_result = ExtensionHelper::FindExtensionInFunctionEntries(entry_name, EXTENSION_FUNCTIONS);
		do {
			if (lookup_result.empty()) {
				break;
			}
			vector<string> other_types;
			string extension_for_error;
			for (auto &function : lookup_result) {
				auto function_type = function.second;
				if (CompareCatalogTypes(type, function_type)) {
					extension_name = function.first;
					break;
				}
				extension_for_error = function.first;
				other_types.push_back(CatalogTypeToString(function_type));
			}
			if (!extension_name.empty()) {
				break;
			}
			if (other_types.size() == 1) {
				auto &function_type = other_types[0];
				auto error =
				    CatalogException("%s with name \"%s\" is not in the catalog, a function by this name exists "
				                     "in the %s extension, but it's of a different type, namely %s",
				                     CatalogTypeToString(type), entry_name, extension_for_error, function_type);
				return error;
			} else {
				D_ASSERT(!other_types.empty());
				auto list_of_types = StringUtil::Join(other_types, ", ");
				auto error =
				    CatalogException("%s with name \"%s\" is not in the catalog, functions with this name exist "
				                     "in the %s extension, but they are of different types, namely %s",
				                     CatalogTypeToString(type), entry_name, extension_for_error, list_of_types);
				return error;
			}
		} while (false);
	} else if (type == CatalogType::TYPE_ENTRY) {
		extension_name = ExtensionHelper::FindExtensionInEntries(entry_name, EXTENSION_TYPES);
	} else if (type == CatalogType::COPY_FUNCTION_ENTRY) {
		extension_name = ExtensionHelper::FindExtensionInEntries(entry_name, EXTENSION_COPY_FUNCTIONS);
	} else if (type == CatalogType::COLLATION_ENTRY) {
		extension_name = ExtensionHelper::FindExtensionInEntries(entry_name, EXTENSION_COLLATIONS);
	}

	// if we found an extension that can handle this catalog entry, create an error hinting the user
	if (!extension_name.empty()) {
		auto error_message = CatalogTypeToString(type) + " with name \"" + entry_name +
		                     "\" is not in the catalog, but it exists in the " + extension_name + " extension.";
		error_message = ExtensionHelper::AddExtensionInstallHintToErrorMsg(context, error_message, extension_name);
		return CatalogException(error_message);
	}

	// entries in other schemas get a penalty
	// however, if there is an exact match in another schema, we will always show it
	static constexpr const double UNSEEN_PENALTY = 0.2;
	auto unseen_entries = SimilarEntriesInSchemas(context, lookup_info, unseen_schemas);
	set<string> suggestions;
	if (!unseen_entries.empty() && (unseen_entries[0].score == 1.0 || unseen_entries[0].score - UNSEEN_PENALTY >
	                                                                      (entries.empty() ? 0.0 : entries[0].score))) {
		// the closest matching entry requires qualification as it is not in the default search path
		// check how to minimally qualify this entry
		for (auto &unseen_entry : unseen_entries) {
			auto catalog_name = unseen_entry.schema->catalog.GetName();
			auto schema_name = unseen_entry.schema->name;
			bool qualify_database;
			bool qualify_schema;
			FindMinimalQualification(retriever, catalog_name, schema_name, qualify_database, qualify_schema);
			auto qualified_name = unseen_entry.GetQualifiedName(qualify_database, qualify_schema);
			suggestions.insert(qualified_name);
		}
	} else if (!entries.empty()) {
		for (auto &entry : entries) {
			suggestions.insert(entry.name);
		}
	}

	string did_you_mean;
	if (suggestions.size() > 2) {
		string last = *suggestions.rbegin();
		suggestions.erase(last);
		did_you_mean = StringUtil::Join(suggestions, ", ") + ", or " + last;
	} else {
		did_you_mean = StringUtil::Join(suggestions, " or ");
	}

	return CatalogException::MissingEntry(lookup_info, did_you_mean);
}